

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O3

optional<pbrt::SampledLight> * __thiscall
pbrt::BVHLightSampler::Sample
          (optional<pbrt::SampledLight> *__return_storage_ptr__,BVHLightSampler *this,
          LightSampleContext *ctx,Float u)

{
  Bounds3f *allb;
  LightBVHNode *pLVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_t sVar4;
  anon_struct_8_0_00000001_for___align aVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  int iVar11;
  LightBVHNode *pLVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  Float FVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 in_ZMM1 [64];
  float fVar22;
  undefined1 auVar23 [16];
  Normal3f n;
  Normal3f n_00;
  Normal3f n_01;
  Point3f p;
  Point3f p_00;
  Point3f p_01;
  Float ci [2];
  float local_bc;
  Float local_a8 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  CompactLightBounds local_80;
  undefined8 uStack_68;
  
  sVar3 = (this->nodes).nStored;
  sVar4 = (this->infiniteLights).nStored;
  auVar7 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,sVar4);
  auVar8 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,(sVar4 + 1) - (ulong)(sVar3 == 0));
  fVar22 = auVar7._0_4_;
  fVar19 = fVar22 / auVar8._0_4_;
  if (u < fVar19) {
    iVar10 = (int)sVar4 + -1;
    auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar19 * u)));
    iVar11 = (int)(auVar7._0_4_ * fVar22);
    if (iVar11 <= iVar10) {
      iVar10 = iVar11;
    }
    aVar5 = (anon_struct_8_0_00000001_for___align)
            (this->infiniteLights).ptr[iVar10].
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align = aVar5;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = fVar19 / fVar22;
    return __return_storage_ptr__;
  }
  if (sVar3 == 0) {
LAB_003ebb2d:
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  }
  else {
    auVar7._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar7._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar7._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar7._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high;
    local_a0._0_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
    local_a0._4_4_ = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
    pLVar12 = (this->nodes).ptr;
    allb = &this->allLightBounds;
    uVar14 = 0;
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                           0x10);
    uStack_98 = 0;
    local_80.w = (pLVar12->lightBounds).w;
    local_80.phi = (pLVar12->lightBounds).phi;
    local_80.field_2 = (pLVar12->lightBounds).field_2;
    local_80.qb[0][0] = *(uint16_t *)((long)((pLVar12->lightBounds).qb + 0) + 0);
    local_80.qb[0][1] = *(uint16_t *)((long)((pLVar12->lightBounds).qb + 0) + 2);
    local_80.qb._4_8_ = *(undefined8 *)((pLVar12->lightBounds).qb[0] + 2);
    uStack_68 = *(undefined8 *)&pLVar12->field_1;
    auVar23._0_4_ = (float)uVar2 + auVar7._0_4_;
    auVar23._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar7._4_4_;
    auVar23._8_4_ = auVar7._8_4_ + 0.0;
    auVar23._12_4_ = auVar7._12_4_ + 0.0;
    auVar8._8_4_ = 0x3f000000;
    auVar8._0_8_ = 0x3f0000003f000000;
    auVar8._12_4_ = 0x3f000000;
    local_90 = vmulps_avx512vl(auVar23,auVar8);
    fVar22 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    fVar20 = 1.0 - fVar19;
    fVar6 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
            + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              high) * 0.5;
    if (-1 < (int)(uint)uStack_68) {
      auVar18._0_4_ = (u - fVar19) / fVar20;
      auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar18);
      local_bc = auVar7._0_4_;
      do {
        auVar7 = local_90;
        uVar15 = (ulong)(uint)uStack_68;
        n.super_Tuple3<pbrt::Normal3,_float>.z = fVar22;
        n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_a0;
        n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_a0._4_4_;
        p.super_Tuple3<pbrt::Point3,_float>.z = fVar6;
        p.super_Tuple3<pbrt::Point3,_float>.x = (float)local_90._0_4_;
        p.super_Tuple3<pbrt::Point3,_float>.y = (float)local_90._4_4_;
        local_90 = auVar7;
        FVar16 = CompactLightBounds::Importance(&pLVar12[uVar14 + 1].lightBounds,p,n,allb);
        auVar7 = local_90;
        n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar22;
        n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_a0;
        n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_a0._4_4_;
        p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar6;
        p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)local_90._0_4_;
        p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)local_90._4_4_;
        local_a8[0] = FVar16;
        local_90 = auVar7;
        local_a8[1] = CompactLightBounds::Importance(&pLVar12[uVar15].lightBounds,p_00,n_00,allb);
        if (((local_a8[1] == 0.0) && (FVar16 == 0.0)) && (!NAN(FVar16))) goto LAB_003ebb2d;
        lVar13 = 0;
        fVar19 = FVar16 + 0.0 + local_a8[1];
        do {
          fVar17 = local_a8[lVar13] / fVar19;
          if (local_bc < fVar17) goto LAB_003eb9e6;
          local_bc = local_bc - fVar17;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 2);
        lVar13 = 2;
LAB_003eb9e6:
        if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
           (iVar10 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)
                                          ::reg), iVar10 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
                     SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
                     {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
          __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
        }
        *(long *)(in_FS_OFFSET + -0x330) = *(long *)(in_FS_OFFSET + -0x330) + 1;
        if (lVar13 == 2) {
          *(long *)(in_FS_OFFSET + -0x338) = *(long *)(in_FS_OFFSET + -0x338) + 1;
          lVar13 = 1;
        }
        fVar19 = local_a8[(int)lVar13] / fVar19;
        pLVar12 = (this->nodes).ptr;
        uVar9 = (uint)uStack_68 & 0x7fffffff;
        if ((int)lVar13 == 0) {
          uVar9 = (int)uVar14 + 1;
        }
        uVar14 = (ulong)uVar9;
        auVar21._0_4_ = local_bc / fVar19;
        auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar21);
        pLVar1 = pLVar12 + uVar14;
        local_80.w = (pLVar1->lightBounds).w;
        local_80.phi = (pLVar1->lightBounds).phi;
        local_80.field_2 = (pLVar1->lightBounds).field_2;
        local_80.qb[0][0] = *(uint16_t *)((long)((pLVar1->lightBounds).qb + 0) + 0);
        local_80.qb[0][1] = *(uint16_t *)((long)((pLVar1->lightBounds).qb + 0) + 2);
        local_80.qb._4_8_ = *(undefined8 *)((pLVar1->lightBounds).qb[0] + 2);
        uStack_68 = *(undefined8 *)&pLVar1->field_1;
        local_bc = auVar7._0_4_;
        fVar20 = fVar20 * fVar19;
      } while (-1 < (int)(uint)uStack_68);
      uVar14 = (ulong)(0 < (int)uVar9);
    }
    auVar7 = local_90;
    if ((char)uVar14 == '\0') {
      n_01.super_Tuple3<pbrt::Normal3,_float>.z = fVar22;
      n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)(undefined4)local_a0;
      n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_a0._4_4_;
      p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar6;
      p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)local_90._0_4_;
      p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)local_90._4_4_;
      local_90 = auVar7;
      FVar16 = CompactLightBounds::Importance(&local_80,p_01,n_01,allb);
      if (FVar16 <= 0.0) goto LAB_003ebb2d;
    }
    aVar5 = (anon_struct_8_0_00000001_for___align)
            (this->lights).ptr[(uint)uStack_68 & 0x7fffffff].
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align = aVar5;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = fVar20;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<SampledLight> Sample(const LightSampleContext &ctx, Float u) const {
        // Compute infinite light sampling probability _pInfinite_
        Float pInfinite = Float(infiniteLights.size()) /
                          Float(infiniteLights.size() + (!nodes.empty() ? 1 : 0));

        if (u < pInfinite) {
            // Sample infinite lights with uniform probability
            u = std::min<Float>(u * pInfinite, OneMinusEpsilon);
            int index =
                std::min<int>(u * infiniteLights.size(), infiniteLights.size() - 1);
            Float pdf = pInfinite * 1.f / infiniteLights.size();
            return SampledLight{infiniteLights[index], pdf};

        } else {
            // Traverse light BVH to sample light
            if (nodes.empty())
                return {};
            // Declare common variables for light BVH traversal
            Point3f p = ctx.p();
            Normal3f n = ctx.ns;
            u = std::min<Float>((u - pInfinite) / (1 - pInfinite), OneMinusEpsilon);
            int nodeIndex = 0;
            Float pdf = (1 - pInfinite);

            while (true) {
                // Process light BVH node for light sampling
                LightBVHNode node = nodes[nodeIndex];
                if (!node.isLeaf) {
                    // Compute light BVH child node importances
                    const LightBVHNode *children[2] = {&nodes[nodeIndex + 1],
                                                       &nodes[node.childOrLightIndex]};
                    Float ci[2] = {
                        children[0]->lightBounds.Importance(p, n, allLightBounds),
                        children[1]->lightBounds.Importance(p, n, allLightBounds)};
                    if (ci[0] == 0 && ci[1] == 0)
                        return {};

                    // Randomly sample light BVH child node
                    Float nodePDF;
                    int child = SampleDiscrete(ci, u, &nodePDF, &u);
                    pdf *= nodePDF;
                    nodeIndex = (child == 0) ? (nodeIndex + 1) : node.childOrLightIndex;

                } else {
                    // Confirm light has non-zero importance before returning light sample
                    if (nodeIndex > 0)
                        DCHECK_GT(node.lightBounds.Importance(p, n, allLightBounds), 0);
                    if (nodeIndex > 0 ||
                        node.lightBounds.Importance(p, n, allLightBounds) > 0)
                        return SampledLight{lights[node.childOrLightIndex], pdf};
                    return {};
                }
            }
        }
    }